

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O2

Transform * __thiscall
lunasvg::SVGMarkerElement::markerTransform
          (Transform *__return_storage_ptr__,SVGMarkerElement *this,Point *origin,float angle,
          float strokeWidth)

{
  Point PVar1;
  Transform transform;
  Transform viewTransform;
  Size local_60;
  Transform local_58;
  Transform local_40;
  
  Transform::translated(&local_58,origin->x,origin->y);
  if ((this->m_orient).m_orientType == Angle) {
    angle = *(float *)&(this->m_orient).super_SVGProperty.field_0xc;
  }
  Transform::rotate(&local_58,angle,0.0,0.0);
  local_60 = markerSize(this);
  SVGFitToViewBox::viewBoxToViewTransform(&local_40,&this->super_SVGFitToViewBox,&local_60);
  local_60 = (Size)refPoint(this);
  PVar1 = Transform::mapPoint(&local_40,(Point *)&local_60);
  if ((this->m_markerUnits).super_SVGProperty.field_0x9 == '\0') {
    Transform::scale(&local_58,strokeWidth,strokeWidth);
  }
  Transform::translate(&local_58,-PVar1.x,-PVar1.y);
  Transform::operator*(__return_storage_ptr__,&local_58,&local_40);
  return __return_storage_ptr__;
}

Assistant:

Transform SVGMarkerElement::markerTransform(const Point& origin, float angle, float strokeWidth) const
{
    auto transform = Transform::translated(origin.x, origin.y);
    if(m_orient.orientType() == SVGAngle::OrientType::Angle) {
        transform.rotate(m_orient.value());
    } else {
        transform.rotate(angle);
    }

    auto viewTransform = viewBoxToViewTransform(markerSize());
    auto refOrigin = viewTransform.mapPoint(refPoint());
    if(m_markerUnits.value() == MarkerUnits::StrokeWidth)
        transform.scale(strokeWidth, strokeWidth);
    transform.translate(-refOrigin.x, -refOrigin.y);
    return transform * viewTransform;
}